

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct.c
# Opt level: O0

IceTImage icetDirectCompose(void)

{
  IceTImage image_00;
  IceTInt *pIVar1;
  IceTInt display_tile_height;
  IceTInt display_tile_width;
  IceTInt *display_tile_viewport;
  IceTInt *tile_viewports;
  IceTInt *tile_image_dest;
  IceTInt tile;
  IceTInt display_tile;
  IceTInt num_contributors;
  IceTInt num_tiles;
  IceTInt max_height;
  IceTInt max_width;
  IceTInt *display_nodes;
  IceTInt *contrib_counts;
  IceTSparseImage IStack_20;
  IceTSizeType sparseImageSize;
  IceTSparseImage outSparseImage;
  IceTVoid *inSparseImageBuffer;
  IceTImage image;
  
  icetGetIntegerv(0x13,&num_tiles);
  icetGetIntegerv(0x14,&num_contributors);
  icetGetIntegerv(0x10,&display_tile);
  contrib_counts._4_4_ = icetSparseImageBufferSize(num_tiles,num_contributors);
  image_00 = icetGetStateBufferImage(0x1a0,num_tiles,num_contributors);
  outSparseImage.opaque_internals = icetGetStateBuffer(0x1a1,contrib_counts._4_4_);
  IStack_20 = icetGetStateBufferSparseImage(0x1a2,num_tiles,num_contributors);
  pIVar1 = (IceTInt *)icetGetStateBuffer(0x1a3,display_tile << 2);
  icetGetIntegerv(0x1b,(IceTInt *)((long)&tile_image_dest + 4));
  if (tile_image_dest._4_4_ < 0) {
    tile = 0;
  }
  else {
    display_nodes = icetUnsafeStateGetInteger(0x8a);
    tile = display_nodes[tile_image_dest._4_4_];
  }
  _max_height = icetUnsafeStateGetInteger(0x1a);
  for (tile_image_dest._0_4_ = 0; (int)tile_image_dest < display_tile;
      tile_image_dest._0_4_ = (int)tile_image_dest + 1) {
    pIVar1[(int)tile_image_dest] = _max_height[(int)tile_image_dest];
  }
  icetRenderTransferFullImages(image_00,outSparseImage.opaque_internals,IStack_20,pIVar1);
  if ((-1 < tile_image_dest._4_4_) && (tile < 1)) {
    pIVar1 = icetUnsafeStateGetInteger(0x11);
    icetImageSetDimensions
              (image_00,pIVar1[(long)(tile_image_dest._4_4_ << 2) + 2],
               pIVar1[(long)(tile_image_dest._4_4_ << 2) + 3]);
    icetClearImage(image_00);
  }
  return (IceTImage)image_00.opaque_internals;
}

Assistant:

IceTImage icetDirectCompose(void)
{
    IceTImage image;
    IceTVoid *inSparseImageBuffer;
    IceTSparseImage outSparseImage;
    IceTSizeType sparseImageSize;
    const IceTInt *contrib_counts;
    const IceTInt *display_nodes;
    IceTInt max_width, max_height;
    IceTInt num_tiles;
    IceTInt num_contributors;
    IceTInt display_tile;
    IceTInt tile;
    IceTInt *tile_image_dest;
    icetRaiseDebug("In Direct Compose");

    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &max_width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &max_height);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);

    sparseImageSize = icetSparseImageBufferSize(max_width, max_height);

    image               = icetGetStateBufferImage(DIRECT_IMAGE_BUFFER,
                                                  max_width, max_height);
    inSparseImageBuffer = icetGetStateBuffer(DIRECT_IN_SPARSE_IMAGE_BUFFER,
                                             sparseImageSize);
    outSparseImage      = icetGetStateBufferSparseImage(
                                                 DIRECT_OUT_SPARSE_IMAGE_BUFFER,
                                                 max_width, max_height);
    tile_image_dest     = icetGetStateBuffer(DIRECT_TILE_IMAGE_DEST_BUFFER,
                                             num_tiles*sizeof(IceTInt));

    icetGetIntegerv(ICET_TILE_DISPLAYED, &display_tile);
    if (display_tile >= 0) {
        contrib_counts = icetUnsafeStateGetInteger(ICET_TILE_CONTRIB_COUNTS);
        num_contributors = contrib_counts[display_tile];
    } else {
        num_contributors = 0;
    }

    display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    for (tile = 0; tile < num_tiles; tile++) {
        tile_image_dest[tile] = display_nodes[tile];
    }

    icetRaiseDebug("Rendering and transferring images.");
    icetRenderTransferFullImages(image,
                                 inSparseImageBuffer,
                                 outSparseImage,
                                 tile_image_dest);

    if ((display_tile >= 0) && (num_contributors < 1)) {
      /* Must be displaying a blank tile. */
        const IceTInt *tile_viewports
            = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
        const IceTInt *display_tile_viewport = tile_viewports + 4*display_tile;
        IceTInt display_tile_width = display_tile_viewport[2];
        IceTInt display_tile_height = display_tile_viewport[3];

        icetRaiseDebug("Returning blank tile.");
        icetImageSetDimensions(image, display_tile_width, display_tile_height);
        icetClearImage(image);
    }

    return image;
}